

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Selector.cpp
# Opt level: O0

void __thiscall Selector::fillPollFds(Selector *this,pollfd *fds,int *numFds)

{
  int iVar1;
  bool bVar2;
  ListenerNode **ppLVar3;
  int local_64;
  list<Selector::ListenerNode_*> local_60;
  iterator listener;
  int i;
  int j;
  AutoLock m;
  int *numFds_local;
  pollfd *fds_local;
  Selector *this_local;
  
  m._16_8_ = numFds;
  AutoLock::AutoLock((AutoLock *)&i,&this->mLock);
  fds->fd = this->mPipe[0];
  fds->events = 1;
  listener.mNode._0_4_ = 1;
  JetHead::list<Selector::ListenerNode_*>::begin
            ((list<Selector::ListenerNode_*> *)&stack0xffffffffffffffb8);
  do {
    JetHead::list<Selector::ListenerNode_*>::end(&local_60);
    bVar2 = JetHead::list<Selector::ListenerNode_*>::iterator::operator!=
                      ((iterator *)&stack0xffffffffffffffb8,(iterator *)&local_60);
    JetHead::list<Selector::ListenerNode_*>::iterator::~iterator((iterator *)&local_60);
    if (!bVar2) {
      local_64 = 2;
LAB_0012e8e5:
      JetHead::list<Selector::ListenerNode_*>::iterator::~iterator
                ((iterator *)&stack0xffffffffffffffb8);
      if (local_64 == 2) {
        *(int *)m._16_8_ = (int)listener.mNode;
        for (listener.mNode._0_4_ = 0; (int)listener.mNode < *(int *)m._16_8_;
            listener.mNode._0_4_ = (int)listener.mNode + 1) {
        }
      }
      AutoLock::~AutoLock((AutoLock *)&i);
      return;
    }
    for (listener.mNode._4_4_ = 1; listener.mNode._4_4_ < (int)listener.mNode;
        listener.mNode._4_4_ = listener.mNode._4_4_ + 1) {
      iVar1 = fds[listener.mNode._4_4_].fd;
      ppLVar3 = JetHead::list<Selector::ListenerNode_*>::iterator::operator*
                          ((iterator *)&stack0xffffffffffffffb8);
      if (iVar1 == (*ppLVar3)->mFd) {
        ppLVar3 = JetHead::list<Selector::ListenerNode_*>::iterator::operator*
                            ((iterator *)&stack0xffffffffffffffb8);
        fds[listener.mNode._4_4_].events = fds[listener.mNode._4_4_].events & (*ppLVar3)->mEvents;
        break;
      }
    }
    if (listener.mNode._4_4_ == (int)listener.mNode) {
      ppLVar3 = JetHead::list<Selector::ListenerNode_*>::iterator::operator*
                          ((iterator *)&stack0xffffffffffffffb8);
      fds[(int)listener.mNode].fd = (*ppLVar3)->mFd;
      ppLVar3 = JetHead::list<Selector::ListenerNode_*>::iterator::operator*
                          ((iterator *)&stack0xffffffffffffffb8);
      fds[(int)listener.mNode].events = (*ppLVar3)->mEvents;
      listener.mNode._0_4_ = (int)listener.mNode + 1;
      if ((int)listener.mNode == 0x40) {
        *(undefined4 *)m._16_8_ = 0x40;
        local_64 = 1;
        goto LAB_0012e8e5;
      }
    }
    JetHead::list<Selector::ListenerNode_*>::iterator::operator++
              ((iterator *)&stack0xffffffffffffffb8);
  } while( true );
}

Assistant:

void Selector::fillPollFds( struct pollfd *fds, int &numFds )
{
	AutoLock m( mLock );
	TRACE_BEGIN( LOG_LVL_INFO );

	fds[ 0 ].fd = mPipe[ PIPE_READER ];
	fds[ 0 ].events = POLLIN;

	int j, i = 1;

	for (JetHead::list<ListenerNode*>::iterator listener = mList.begin(); 
		 listener != mList.end(); ++listener)
	{
		// If we already have this fd in our list, skip it
		for ( j = 1; j < i; j++ )
		{
			if ( fds[ j ].fd == (*listener)->mFd )
			{
				fds[ j ].events &= (*listener)->mEvents;
				break;
			}
		}
		
		if ( j == i )
		{
			fds[ i ].fd = (*listener)->mFd;
			fds[ i ].events = (*listener)->mEvents;
			i++;

			if ( i == kMaxPollFds )
			{
				numFds = kMaxPollFds;
				return;
			}
		}
	}
	
	numFds = i;
	
	for ( i = 0; i < numFds; i++ )
	{
		LOG_NOISE( "file entry %d: fd %d events %x", i, fds[ i ].fd, fds[ i ].events );
	}
	
	LOG( "poll on %d fds, size %d", numFds, mList.size() );
}